

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_remIleavedBits_const_manual_::
~Test_bitileave_remIleavedBits_const_manual_(Test_bitileave_remIleavedBits_const_manual_ *this)

{
  Test::~Test(&this->super_Test);
  operator_delete(this,0x18);
  return;
}

Assistant:

BITMANIP_TEST(bitileave, remIleavedBits_const_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<0>(0xff), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<1>(0xff), 0xfu);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<1>(0b01010101), 0b1111u);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<1>(0x5555'5555'5555'5555), 0xffff'ffffu);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<3>(0x1111'1111'1111'1111), 0b1111'1111'1111'1111u);

    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<4>(12345678), detail::remIleavedBits_naive(12345678, 4));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<8>(12345678), detail::remIleavedBits_naive(12345678, 8));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<16>(12345678), detail::remIleavedBits_naive(12345678, 16));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<32>(12345678), detail::remIleavedBits_naive(12345678, 32));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<63>(12345678), detail::remIleavedBits_naive(12345678, 63));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<64>(12345678), detail::remIleavedBits_naive(12345678, 64));
}